

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# descriptor.cc
# Opt level: O2

void __thiscall
google::protobuf::DescriptorBuilder::ValidateFileOptions
          (DescriptorBuilder *this,FileDescriptor *file,FileDescriptorProto *proto)

{
  long lVar1;
  string *element_name;
  bool bVar2;
  Type *proto_00;
  Type *proto_01;
  Type *proto_02;
  Type *proto_03;
  FileDescriptor *pFVar3;
  long lVar4;
  int index;
  int i;
  long lVar5;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_70;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_50;
  
  lVar4 = 0;
  for (lVar5 = 0; lVar5 < *(int *)(file + 0x58); lVar5 = lVar5 + 1) {
    lVar1 = *(long *)(file + 0x60);
    proto_00 = internal::RepeatedPtrFieldBase::
               Get<google::protobuf::RepeatedPtrField<google::protobuf::DescriptorProto>::TypeHandler>
                         (&(proto->message_type_).super_RepeatedPtrFieldBase,(int)lVar5);
    ValidateMessageOptions(this,(Descriptor *)(lVar1 + lVar4),proto_00);
    lVar4 = lVar4 + 0xa8;
  }
  lVar4 = 0;
  for (lVar5 = 0; lVar5 < *(int *)(file + 0x68); lVar5 = lVar5 + 1) {
    lVar1 = *(long *)(file + 0x70);
    proto_01 = internal::RepeatedPtrFieldBase::
               Get<google::protobuf::RepeatedPtrField<google::protobuf::EnumDescriptorProto>::TypeHandler>
                         (&(proto->enum_type_).super_RepeatedPtrFieldBase,(int)lVar5);
    ValidateEnumOptions(this,(EnumDescriptor *)(lVar1 + lVar4),proto_01);
    lVar4 = lVar4 + 0x38;
  }
  lVar4 = 0;
  for (lVar5 = 0; lVar5 < *(int *)(file + 0x78); lVar5 = lVar5 + 1) {
    lVar1 = *(long *)(file + 0x80);
    proto_02 = internal::RepeatedPtrFieldBase::
               Get<google::protobuf::RepeatedPtrField<google::protobuf::ServiceDescriptorProto>::TypeHandler>
                         (&(proto->service_).super_RepeatedPtrFieldBase,(int)lVar5);
    ValidateServiceOptions(this,(ServiceDescriptor *)(lVar1 + lVar4),proto_02);
    lVar4 = lVar4 + 0x30;
  }
  lVar4 = 0;
  for (lVar5 = 0; lVar5 < *(int *)(file + 0x88); lVar5 = lVar5 + 1) {
    lVar1 = *(long *)(file + 0x98);
    proto_03 = internal::RepeatedPtrFieldBase::
               Get<google::protobuf::RepeatedPtrField<google::protobuf::FieldDescriptorProto>::TypeHandler>
                         (&(proto->extension_).super_RepeatedPtrFieldBase,(int)lVar5);
    ValidateFieldOptions(this,(FieldDescriptor *)(lVar1 + lVar4),proto_03);
    lVar4 = lVar4 + 0xa8;
  }
  bVar2 = IsLite(file);
  if (!bVar2) {
    for (index = 0; index < *(int *)(file + 0x18); index = index + 1) {
      pFVar3 = FileDescriptor::dependency(file,index);
      bVar2 = IsLite(pFVar3);
      if (bVar2) {
        element_name = *(string **)file;
        pFVar3 = FileDescriptor::dependency(file,index);
        std::operator+(&local_50,
                       "Files that do not use optimize_for = LITE_RUNTIME cannot import files which do use this option.  This file is not lite, but it imports \""
                       ,*(basic_string<char,_std::char_traits<char>,_std::allocator<char>_> **)
                         pFVar3);
        std::operator+(&local_70,&local_50,"\" which is.");
        AddError(this,element_name,&proto->super_Message,OTHER,&local_70);
        std::__cxx11::string::~string((string *)&local_70);
        std::__cxx11::string::~string((string *)&local_50);
        break;
      }
    }
  }
  if (*(int *)(file + 0x8c) == 3) {
    ValidateProto3(this,file,proto);
  }
  return;
}

Assistant:

void DescriptorBuilder::ValidateFileOptions(FileDescriptor* file,
                                            const FileDescriptorProto& proto) {
  VALIDATE_OPTIONS_FROM_ARRAY(file, message_type, Message);
  VALIDATE_OPTIONS_FROM_ARRAY(file, enum_type, Enum);
  VALIDATE_OPTIONS_FROM_ARRAY(file, service, Service);
  VALIDATE_OPTIONS_FROM_ARRAY(file, extension, Field);

  // Lite files can only be imported by other Lite files.
  if (!IsLite(file)) {
    for (int i = 0; i < file->dependency_count(); i++) {
      if (IsLite(file->dependency(i))) {
        AddError(
          file->name(), proto,
          DescriptorPool::ErrorCollector::OTHER,
          "Files that do not use optimize_for = LITE_RUNTIME cannot import "
          "files which do use this option.  This file is not lite, but it "
          "imports \"" + file->dependency(i)->name() + "\" which is.");
        break;
      }
    }
  }
  if (file->syntax() == FileDescriptor::SYNTAX_PROTO3) {
    ValidateProto3(file, proto);
  }
}